

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

double helics::randDouble(RandomDistributions dist,double param1,double param2)

{
  long lVar1;
  undefined1 auVar2 [8];
  int iVar3;
  result_type_conflict1 rVar4;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  long *in_FS_OFFSET;
  double dVar5;
  result_type_conflict rVar6;
  result_type_conflict rVar7;
  normal_distribution<double> distribution;
  undefined1 local_13a0 [8];
  undefined1 local_1398 [4992];
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -0x1428) == '\0') {
    std::random_device::random_device((random_device *)local_13a0);
    std::random_device::_M_getval();
    randDouble();
    *(undefined8 *)(lVar1 + -0x1430) = 0x270;
    std::random_device::_M_fini();
    *(undefined1 *)(lVar1 + -0x1428) = 1;
  }
  local_13a0 = (undefined1  [8])param1;
  local_1398._0_8_ = param2;
  switch(dist) {
  case UNIFORM:
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0));
    dVar5 = (param2 - param1) * dVar5;
    goto LAB_0020ad0b;
  case BERNOULLI:
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0));
    param1 = (double)(-(ulong)(dVar5 < param1) & (ulong)param2);
    break;
  case BINOMIAL:
    local_13a0._0_4_ = (int)param1;
    std::binomial_distribution<int>::param_type::_M_initialize((param_type *)local_13a0);
    local_1398._104_8_ = 0.0;
    local_1398._112_8_ = 1.0;
    local_1398._120_8_ = 0.0;
    local_1398[0x80] = false;
    rVar4 = std::binomial_distribution<int>::operator()
                      ((binomial_distribution<int> *)local_13a0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)local_13a0);
    param1 = (double)rVar4;
    break;
  case GEOMETRIC:
    local_1398._0_8_ = log(1.0 - param1);
    iVar3 = std::geometric_distribution<int>::operator()
                      ((geometric_distribution<int> *)local_13a0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)local_13a0);
    goto LAB_0020ade7;
  case POISSON:
    std::poisson_distribution<int>::param_type::_M_initialize((param_type *)local_13a0);
    local_1398._64_8_ = 0.0;
    local_1398._72_8_ = 1.0;
    local_1398._80_8_ = 0.0;
    local_1398._88_8_ = local_1398._88_8_ & 0xffffffffffffff00;
    iVar3 = std::poisson_distribution<int>::operator()
                      ((poisson_distribution<int> *)local_13a0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)local_13a0);
LAB_0020ade7:
    dVar5 = (double)iVar3;
LAB_0020ae30:
    param1 = dVar5 * param2;
    break;
  case EXPONENTIAL:
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0));
    dVar5 = log(1.0 - dVar5);
    param1 = -dVar5 / param1;
    break;
  case GAMMA:
    local_1398._8_8_ =
         ~-(ulong)(param1 < 1.0) & (ulong)param1 | (ulong)(param1 + 1.0) & -(ulong)(param1 < 1.0);
    dVar5 = ((double)local_1398._8_8_ + -0.3333333333333333) * 9.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1398._16_8_ = 1.0 / dVar5;
    local_1398._24_8_ = 0.0;
    local_1398._32_8_ = 1.0;
    local_1398._40_8_ = 0.0;
    local_1398._48_8_ = local_1398._48_8_ & 0xffffffffffffff00;
    param1 = std::gamma_distribution<double>::operator()
                       ((gamma_distribution<double> *)local_13a0,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(lVar1 + -0x27b0),(param_type *)local_13a0);
    break;
  case WEIBULL:
    dVar5 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0));
    dVar5 = log(1.0 - dVar5);
    dVar5 = pow(-dVar5,1.0 / param1);
    goto LAB_0020ae30;
  case EXTREME_VALUE:
    param1 = std::extreme_value_distribution<double>::operator()
                       ((extreme_value_distribution<double> *)local_13a0,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(lVar1 + -0x27b0),(param_type *)local_13a0);
    break;
  case NORMAL:
    local_1398._8_8_ = 0.0;
    local_1398._16_8_ = local_1398._16_8_ & 0xffffffffffffff00;
    param1 = std::normal_distribution<double>::operator()
                       ((normal_distribution<double> *)local_13a0,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(lVar1 + -0x27b0),(param_type *)local_13a0);
    break;
  case LOGNORMAL:
    local_1398._8_8_ = 0.0;
    local_1398._16_8_ = 1.0;
    local_1398._24_8_ = 0.0;
    local_1398._32_8_ = local_1398._32_8_ & 0xffffffffffffff00;
    rVar6 = std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)(local_1398 + 8),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)(local_1398 + 8));
    param1 = exp(rVar6 * param2 + (double)local_13a0);
    break;
  case CHI_SQUARED:
    local_1398._0_8_ = param1 * 0.5;
    local_1398._8_8_ = 1.0;
    local_1398._16_8_ =
         ~-(ulong)((double)local_1398._0_8_ < 1.0) & local_1398._0_8_ |
         (ulong)((double)local_1398._0_8_ + 1.0) & -(ulong)((double)local_1398._0_8_ < 1.0);
    dVar5 = ((double)local_1398._16_8_ + -0.3333333333333333) * 9.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1398._24_8_ = 1.0 / dVar5;
    local_1398._32_8_ = 0.0;
    local_1398._40_8_ = 1.0;
    local_1398._48_8_ = 0.0;
    local_1398._56_8_ = local_1398._56_8_ & 0xffffffffffffff00;
    rVar6 = std::gamma_distribution<double>::operator()
                      ((gamma_distribution<double> *)local_1398,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)local_1398);
    param1 = rVar6 + rVar6;
    break;
  case CAUCHY:
    do {
      dVar5 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)(lVar1 + -0x27b0));
    } while (dVar5 == 0.5);
    dVar5 = tan(dVar5 * 3.141592653589793);
    dVar5 = param2 * dVar5;
LAB_0020ad0b:
    param1 = param1 + dVar5;
    break;
  case FISHER_F:
    local_1398._8_8_ = param1 * 0.5;
    local_1398._16_8_ = 1.0;
    local_1398._24_8_ =
         ~-(ulong)((double)local_1398._8_8_ < 1.0) & local_1398._8_8_ |
         (ulong)((double)local_1398._8_8_ + 1.0) & -(ulong)((double)local_1398._8_8_ < 1.0);
    dVar5 = ((double)local_1398._24_8_ + -0.3333333333333333) * 9.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1398._32_8_ = 1.0 / dVar5;
    local_1398._40_8_ = 0.0;
    local_1398._48_8_ = 1.0;
    local_1398._56_8_ = 0.0;
    local_1398._64_8_ = local_1398._64_8_ & 0xffffffffffffff00;
    local_1398._72_8_ = param2 * 0.5;
    local_1398._80_8_ = 1.0;
    local_1398._88_8_ =
         ~-(ulong)((double)local_1398._72_8_ < 1.0) & local_1398._72_8_ |
         (ulong)((double)local_1398._72_8_ + 1.0) & -(ulong)((double)local_1398._72_8_ < 1.0);
    dVar5 = ((double)local_1398._88_8_ + -0.3333333333333333) * 9.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1398._104_8_ = 0.0;
    local_1398._96_8_ = 1.0 / dVar5;
    local_1398._112_8_ = 1.0;
    local_1398._120_8_ = 0.0;
    local_1398[0x80] = false;
    param1 = std::fisher_f_distribution<double>::operator()
                       ((fisher_f_distribution<double> *)local_13a0,
                        (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                         *)(lVar1 + -0x27b0));
    break;
  case STUDENT_T:
    local_1398._0_8_ = (_func_result_type_void_ptr *)0x0;
    local_1398._8_8_ = 1.0;
    local_1398._16_8_ = 0.0;
    local_1398._24_8_ = local_1398._24_8_ & 0xffffffffffffff00;
    local_1398._32_8_ = param1 * 0.5;
    local_1398._40_8_ = 2.0;
    local_1398._48_8_ =
         ~-(ulong)((double)local_1398._32_8_ < 1.0) & local_1398._32_8_ |
         (ulong)((double)local_1398._32_8_ + 1.0) & -(ulong)((double)local_1398._32_8_ < 1.0);
    dVar5 = ((double)local_1398._48_8_ + -0.3333333333333333) * 9.0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_1398._64_8_ = 0.0;
    local_1398._56_8_ = 1.0 / dVar5;
    local_1398._72_8_ = 1.0;
    local_1398._80_8_ = 0.0;
    local_1398._88_8_ = local_1398._88_8_ & 0xffffffffffffff00;
    rVar6 = std::normal_distribution<double>::operator()
                      ((normal_distribution<double> *)local_1398,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)local_1398);
    auVar2 = local_13a0;
    rVar7 = std::gamma_distribution<double>::operator()
                      ((gamma_distribution<double> *)(local_1398 + 0x20),
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x27b0),(param_type *)(local_1398 + 0x20));
    dVar5 = (double)auVar2 / rVar7;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    param1 = rVar6 * dVar5;
  }
  return param1;
}

Assistant:

double randDouble(RandomDistributions dist, double param1, double param2)
{
    static thread_local std::mt19937 generator(
        std::random_device{}() +
        static_cast<unsigned int>(std::hash<std::thread::id>{}(std::this_thread::get_id())));

    switch (dist) {
        case RandomDistributions::CONSTANT:
        default:
            return param1;
        case RandomDistributions::UNIFORM: {
            std::uniform_real_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::NORMAL: {
            std::normal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::LOGNORMAL: {
            std::lognormal_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CAUCHY: {
            std::cauchy_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::CHI_SQUARED: {
            std::chi_squared_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXPONENTIAL: {
            std::exponential_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::EXTREME_VALUE: {
            std::extreme_value_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::FISHER_F: {
            std::fisher_f_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::WEIBULL: {
            std::weibull_distribution<double> distribution(param1, param2);
            return distribution(generator);
        }
        case RandomDistributions::STUDENT_T: {
            std::student_t_distribution<double> distribution(param1);
            return distribution(generator);
        }
        case RandomDistributions::GEOMETRIC: {  // integer multiples of some period
            std::geometric_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::POISSON: {  // integer multiples of some period
            std::poisson_distribution<int> distribution(param1);
            return distribution(generator) * param2;
        }
        case RandomDistributions::BERNOULLI: {
            std::bernoulli_distribution distribution(param1);
            return distribution(generator) ? param2 : 0.0;
        }
        case RandomDistributions::BINOMIAL: {
            std::binomial_distribution<int> distribution(static_cast<int>(param1), param2);
            return static_cast<double>(distribution(generator));
        }
        case RandomDistributions::GAMMA: {
            std::gamma_distribution<double> distribution(param1, param2);
            return distribution(generator);
        } break;
    }

    // return 0.0;
}